

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_push<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *in,int element)

{
  rrb<int,_false,_6> *prVar1;
  leaf_node<int,_false> *plVar2;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_30;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb<int,_false,_6>_> new_rrb;
  int element_local;
  ref<immutable::rrb<int,_false,_6>_> *in_local;
  
  prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  if (prVar1->tail_len < 0x40) {
    prVar1 = rrb_details::rrb_tail_push<int,false,6>(in,element);
    ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,prVar1);
  }
  else {
    prVar1 = rrb_details::rrb_head_clone<int,false,6>(in->ptr);
    ref<immutable::rrb<int,_false,_6>_>::ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&new_tail,prVar1);
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->
                       ((ref<immutable::rrb<int,_false,_6>_> *)&new_tail);
    prVar1->cnt = prVar1->cnt + 1;
    plVar2 = rrb_details::leaf_node_create<int,false>(1);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_30,plVar2);
    plVar2 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_30);
    *plVar2->child = element;
    prVar1 = ref<immutable::rrb<int,_false,_6>_>::operator->
                       ((ref<immutable::rrb<int,_false,_6>_> *)&new_tail);
    prVar1->tail_len = 1;
    rrb_details::push_down_tail<int,false,6>
              ((rrb_details *)this,in,(ref<immutable::rrb<int,_false,_6>_> *)&new_tail,&local_30);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_30);
    ref<immutable::rrb<int,_false,_6>_>::~ref((ref<immutable::rrb<int,_false,_6>_> *)&new_tail);
  }
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
    {
    using namespace rrb_details;
    if (in->tail_len < bits<N>::rrb_branching)
      {
      return rrb_details::rrb_tail_push(in, std::move(element));
      }
    ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
    new_rrb->cnt++;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(1);
    new_tail->child[0] = std::move(element);
    new_rrb->tail_len = 1;
    return push_down_tail(in, new_rrb, new_tail);
    }